

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O2

int IDAGetNumPrecSolves(void *ida_mem,long *npsolves)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_18;
  IDAMem local_10;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDAGetNumPrecSolves",&local_10,&local_18);
  if (iVar1 == 0) {
    *npsolves = local_18->nps;
  }
  return iVar1;
}

Assistant:

int IDAGetNumPrecSolves(void* ida_mem, long int* npsolves)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure; store output and return */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }
  *npsolves = idals_mem->nps;
  return (IDALS_SUCCESS);
}